

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

MOTION_MODE read_motion_mode(AV1_COMMON *cm,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,aom_reader *r)

{
  MOTION_MODE MVar1;
  int iVar2;
  WarpedMotionParams *in_RCX;
  long in_RDX;
  long in_RDI;
  int motion_mode;
  MOTION_MODE last_motion_mode_allowed;
  MB_MODE_INFO *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar3;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x1f7) & 1) == 0) {
    local_1 = '\0';
  }
  else if ((*(ushort *)(in_RDX + 0xa7) >> 6 & 1) == 0) {
    MVar1 = motion_mode_allowed(in_RCX,(MACROBLOCKD *)
                                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                                ,in_stack_ffffffffffffffc8,0);
    uVar3 = CONCAT13(MVar1,(int3)in_stack_ffffffffffffffd4);
    if (MVar1 == '\0') {
      local_1 = '\0';
    }
    else if (MVar1 == '\x01') {
      iVar2 = aom_read_symbol_((aom_reader *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                               (aom_cdf_prob *)in_stack_ffffffffffffffc8,0);
      local_1 = (MOTION_MODE)iVar2;
    }
    else {
      iVar2 = aom_read_symbol_((aom_reader *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                               (aom_cdf_prob *)in_stack_ffffffffffffffc8,0);
      local_1 = (MOTION_MODE)iVar2;
    }
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static MOTION_MODE read_motion_mode(AV1_COMMON *cm, MACROBLOCKD *xd,
                                    MB_MODE_INFO *mbmi, aom_reader *r) {
  if (cm->features.switchable_motion_mode == 0) return SIMPLE_TRANSLATION;
  if (mbmi->skip_mode) return SIMPLE_TRANSLATION;

  const MOTION_MODE last_motion_mode_allowed = motion_mode_allowed(
      xd->global_motion, xd, mbmi, cm->features.allow_warped_motion);
  int motion_mode;

  if (last_motion_mode_allowed == SIMPLE_TRANSLATION) return SIMPLE_TRANSLATION;

  if (last_motion_mode_allowed == OBMC_CAUSAL) {
    motion_mode =
        aom_read_symbol(r, xd->tile_ctx->obmc_cdf[mbmi->bsize], 2, ACCT_STR);
    return (MOTION_MODE)(SIMPLE_TRANSLATION + motion_mode);
  } else {
    motion_mode = aom_read_symbol(r, xd->tile_ctx->motion_mode_cdf[mbmi->bsize],
                                  MOTION_MODES, ACCT_STR);
    return (MOTION_MODE)(SIMPLE_TRANSLATION + motion_mode);
  }
}